

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

optional<UniValue> *
InterpretValue(optional<UniValue> *__return_storage_ptr__,KeyInfo *key,string *value,uint flags,
              string *error)

{
  pointer pcVar1;
  int iVar2;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string_view source_file;
  _Alloc_hider in_stack_ffffffffffffffb8;
  _Alloc_hider _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (key->negated == true) {
    if ((flags & 0x20) == 0) {
      if ((value != (string *)0x0) && (value->_M_string_length != 0)) {
        str._M_str = (value->_M_dataplus)._M_p;
        str._M_len = value->_M_string_length;
        iVar2 = LocaleIndependentAtoi<int>(str);
        if (iVar2 == 0) {
          logging_function._M_str = "InterpretValue";
          logging_function._M_len = 0xe;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
          ;
          source_file._M_len = 0x58;
          LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                    (logging_function,source_file,0x76,
                     IPC|QT|PROXY|PRUNE|CMPCTBLOCK|SELECTCOINS|ESTIMATEFEE|RPC|WALLETDB|ZMQ|HTTP|
                     MEMPOOL,(Level)key,(char *)value,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffffb8._M_p,in_stack_ffffffffffffffc0);
          UniValue::UniValue<bool,_bool,_true>
                    ((UniValue *)__return_storage_ptr__,(bool *)&stack0xffffffffffffffb8);
          (__return_storage_ptr__->super__Optional_base<UniValue,_false,_false>)._M_payload.
          super__Optional_payload<UniValue,_true,_false,_false>.
          super__Optional_payload_base<UniValue>._M_engaged = true;
          goto LAB_00697b61;
        }
      }
      UniValue::UniValue<bool,_bool,_true>
                ((UniValue *)__return_storage_ptr__,(bool *)&stack0xffffffffffffffb8);
      (__return_storage_ptr__->super__Optional_base<UniValue,_false,_false>)._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_engaged = true;
    }
    else {
      InterpretValue();
    }
  }
  else if ((flags & 0x40) == 0 || value != (string *)0x0) {
    _Var3._M_p = (pointer)&local_38;
    if (value == (string *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffffb8,"");
    }
    else {
      pcVar1 = (value->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xffffffffffffffb8,pcVar1,pcVar1 + value->_M_string_length);
    }
    UniValue::
    UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffb8);
    (__return_storage_ptr__->super__Optional_base<UniValue,_false,_false>)._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_engaged = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_38) {
      operator_delete(_Var3._M_p,local_38._M_allocated_capacity + 1);
    }
  }
  else {
    InterpretValue();
  }
LAB_00697b61:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<common::SettingsValue> InterpretValue(const KeyInfo& key, const std::string* value,
                                                  unsigned int flags, std::string& error)
{
    // Return negated settings as false values.
    if (key.negated) {
        if (flags & ArgsManager::DISALLOW_NEGATION) {
            error = strprintf("Negating of -%s is meaningless and therefore forbidden", key.name);
            return std::nullopt;
        }
        // Double negatives like -nofoo=0 are supported (but discouraged)
        if (value && !InterpretBool(*value)) {
            LogPrintf("Warning: parsed potentially confusing double-negative -%s=%s\n", key.name, *value);
            return true;
        }
        return false;
    }
    if (!value && (flags & ArgsManager::DISALLOW_ELISION)) {
        error = strprintf("Can not set -%s with no value. Please specify value with -%s=value.", key.name, key.name);
        return std::nullopt;
    }
    return value ? *value : "";
}